

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Collider CVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  byte *pbVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  uint uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  byte *pbVar31;
  byte *pbVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  float fVar42;
  float fVar54;
  float fVar55;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar56;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar62;
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  float fVar67;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  float fVar73;
  float fVar74;
  undefined1 auVar70 [16];
  float fVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  float fVar82;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar83;
  float fVar84;
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [16];
  float fVar99;
  float fVar100;
  undefined4 uVar101;
  float fVar102;
  undefined4 uVar103;
  float fVar104;
  undefined4 uVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_11b8;
  int local_119c;
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1188 [16];
  long local_1170;
  long local_1168;
  ulong local_1160;
  undefined1 (*local_1158) [16];
  byte *local_1150;
  RayHit *local_1148;
  long local_1140;
  int *local_1138;
  byte *local_1130;
  uint *local_1128;
  Intersectors *local_1120;
  undefined4 *local_1118;
  undefined4 local_1110;
  undefined4 local_1108;
  undefined4 local_1104;
  float local_1100;
  float local_10fc;
  float local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  float local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1068 [16];
  float local_1058 [4];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008 [4];
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar30;
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_1148 = ray;
    pauVar38 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    fVar112 = *(float *)&This->ptr;
    fVar115 = *(float *)((long)&This->ptr + 4);
    fVar106 = *(float *)&This->leafIntersector;
    fVar109 = *(float *)((long)&This->leafIntersector + 4);
    CVar13 = This->collider;
    fVar129 = 0.0;
    if (0.0 <= fVar109) {
      fVar129 = fVar109;
    }
    fVar109 = *(float *)&(This->intersector1).intersect;
    auVar43._4_4_ = -(uint)(ABS(CVar13.collide._4_4_) < DAT_01f4bd50._4_4_);
    auVar43._0_4_ = -(uint)(ABS(CVar13.collide._0_4_) < (float)DAT_01f4bd50);
    auVar43._8_4_ = -(uint)(ABS(CVar13.name._0_4_) < DAT_01f4bd50._8_4_);
    auVar43._12_4_ = -(uint)(ABS(CVar13.name._4_4_) < DAT_01f4bd50._12_4_);
    auVar77 = blendvps((undefined1  [16])CVar13,_DAT_01f4bd50,auVar43);
    fVar69 = 0.0;
    if (0.0 <= fVar109) {
      fVar69 = fVar109;
    }
    auVar43 = rcpps(auVar43,auVar77);
    fVar110 = auVar43._0_4_;
    fVar113 = auVar43._4_4_;
    fVar116 = auVar43._8_4_;
    fVar110 = (1.0 - auVar77._0_4_ * fVar110) * fVar110 + fVar110;
    fVar113 = (1.0 - auVar77._4_4_ * fVar113) * fVar113 + fVar113;
    fVar116 = (1.0 - auVar77._8_4_ * fVar116) * fVar116 + fVar116;
    uVar36 = (ulong)(fVar110 < 0.0) << 4;
    uVar41 = (ulong)(fVar113 < 0.0) << 4 | 0x20;
    uVar39 = (ulong)(fVar116 < 0.0) << 4 | 0x40;
    uVar40 = uVar36 ^ 0x10;
    auVar77._4_4_ = fVar69;
    auVar77._0_4_ = fVar69;
    auVar77._8_4_ = fVar69;
    auVar77._12_4_ = fVar69;
    _local_ff8 = mm_lookupmask_ps._240_8_;
    _uStack_ff0 = mm_lookupmask_ps._248_8_;
    local_f88 = fVar106;
    fStack_f84 = fVar106;
    fStack_f80 = fVar106;
    fStack_f7c = fVar106;
    local_f98 = fVar129;
    fStack_f94 = fVar129;
    fStack_f90 = fVar129;
    fStack_f8c = fVar129;
    local_fa8 = fVar116;
    fStack_fa4 = fVar116;
    fStack_fa0 = fVar116;
    fStack_f9c = fVar116;
    local_fb8 = fVar112;
    fStack_fb4 = fVar112;
    fStack_fb0 = fVar112;
    fStack_fac = fVar112;
    local_fc8 = fVar115;
    fStack_fc4 = fVar115;
    fStack_fc0 = fVar115;
    fStack_fbc = fVar115;
    local_fd8 = fVar110;
    fStack_fd4 = fVar110;
    fStack_fd0 = fVar110;
    fStack_fcc = fVar110;
    local_fe8 = fVar113;
    fStack_fe4 = fVar113;
    fStack_fe0 = fVar113;
    fStack_fdc = fVar113;
    pauVar25 = (undefined1 (*) [16])mm_lookupmask_ps;
    fVar69 = fVar106;
    fVar42 = fVar106;
    fVar54 = fVar106;
    fVar55 = fVar129;
    fVar56 = fVar129;
    fVar57 = fVar129;
    fVar62 = fVar116;
    fVar63 = fVar116;
    fVar64 = fVar116;
    fVar67 = fVar112;
    fVar68 = fVar112;
    fVar73 = fVar112;
    fVar74 = fVar115;
    fVar75 = fVar115;
    fVar76 = fVar115;
    fVar82 = fVar110;
    fVar83 = fVar110;
    fVar84 = fVar110;
    fVar89 = fVar113;
    fVar90 = fVar113;
    fVar94 = fVar113;
LAB_006856e4:
    if (pauVar38 != (undefined1 (*) [16])&local_f78) {
      pauVar26 = pauVar38 + -1;
      pauVar38 = pauVar38 + -1;
      if (*(float *)((long)*pauVar26 + 8) <= fVar109) {
        pauVar26 = pauVar25;
        uVar33 = *(ulong *)*pauVar38;
        while ((uVar33 & 8) == 0) {
          fVar96 = *(float *)((long)&(This->collider).name + 4);
          fVar109 = *(float *)&(This->intersector1).intersect;
          pauVar25 = (undefined1 (*) [16])(uVar33 & 0xfffffffffffffff0);
          pfVar5 = (float *)((long)pauVar25[8] + uVar36);
          pfVar1 = (float *)((long)pauVar25[2] + uVar36);
          auVar81._0_4_ = ((*pfVar5 * fVar96 + *pfVar1) - fVar112) * fVar110;
          auVar81._4_4_ = ((pfVar5[1] * fVar96 + pfVar1[1]) - fVar67) * fVar82;
          auVar81._8_4_ = ((pfVar5[2] * fVar96 + pfVar1[2]) - fVar68) * fVar83;
          auVar81._12_4_ = ((pfVar5[3] * fVar96 + pfVar1[3]) - fVar73) * fVar84;
          auVar78._4_4_ = fVar55;
          auVar78._0_4_ = fVar129;
          auVar78._8_4_ = fVar56;
          auVar78._12_4_ = fVar57;
          auVar43 = maxps(auVar78,auVar81);
          pfVar5 = (float *)((long)pauVar25[8] + uVar41);
          pfVar1 = (float *)((long)pauVar25[2] + uVar41);
          auVar88._0_4_ = ((*pfVar5 * fVar96 + *pfVar1) - fVar115) * fVar113;
          auVar88._4_4_ = ((pfVar5[1] * fVar96 + pfVar1[1]) - fVar74) * fVar89;
          auVar88._8_4_ = ((pfVar5[2] * fVar96 + pfVar1[2]) - fVar75) * fVar90;
          auVar88._12_4_ = ((pfVar5[3] * fVar96 + pfVar1[3]) - fVar76) * fVar94;
          pfVar5 = (float *)((long)pauVar25[8] + uVar39);
          pfVar1 = (float *)((long)pauVar25[2] + uVar39);
          auVar93._0_4_ = ((*pfVar5 * fVar96 + *pfVar1) - fVar106) * fVar116;
          auVar93._4_4_ = ((pfVar5[1] * fVar96 + pfVar1[1]) - fVar69) * fVar62;
          auVar93._8_4_ = ((pfVar5[2] * fVar96 + pfVar1[2]) - fVar42) * fVar63;
          auVar93._12_4_ = ((pfVar5[3] * fVar96 + pfVar1[3]) - fVar54) * fVar64;
          auVar78 = maxps(auVar88,auVar93);
          _local_10b8 = maxps(auVar43,auVar78);
          pfVar5 = (float *)((long)pauVar25[8] + uVar40);
          pfVar1 = (float *)((long)pauVar25[2] + uVar40);
          auVar85._0_4_ = ((*pfVar5 * fVar96 + *pfVar1) - fVar112) * fVar110;
          auVar85._4_4_ = ((pfVar5[1] * fVar96 + pfVar1[1]) - fVar67) * fVar82;
          auVar85._8_4_ = ((pfVar5[2] * fVar96 + pfVar1[2]) - fVar68) * fVar83;
          auVar85._12_4_ = ((pfVar5[3] * fVar96 + pfVar1[3]) - fVar73) * fVar84;
          auVar43 = minps(auVar77,auVar85);
          pfVar5 = (float *)((long)pauVar25[8] + (uVar41 ^ 0x10));
          pfVar1 = (float *)((long)pauVar25[2] + (uVar41 ^ 0x10));
          auVar86._0_4_ = ((*pfVar5 * fVar96 + *pfVar1) - fVar115) * fVar113;
          auVar86._4_4_ = ((pfVar5[1] * fVar96 + pfVar1[1]) - fVar74) * fVar89;
          auVar86._8_4_ = ((pfVar5[2] * fVar96 + pfVar1[2]) - fVar75) * fVar90;
          auVar86._12_4_ = ((pfVar5[3] * fVar96 + pfVar1[3]) - fVar76) * fVar94;
          pfVar5 = (float *)((long)pauVar25[8] + (uVar39 ^ 0x10));
          pfVar1 = (float *)((long)pauVar25[2] + (uVar39 ^ 0x10));
          auVar91._0_4_ = ((*pfVar5 * fVar96 + *pfVar1) - fVar106) * fVar116;
          auVar91._4_4_ = ((pfVar5[1] * fVar96 + pfVar1[1]) - fVar69) * fVar62;
          auVar91._8_4_ = ((pfVar5[2] * fVar96 + pfVar1[2]) - fVar42) * fVar63;
          auVar91._12_4_ = ((pfVar5[3] * fVar96 + pfVar1[3]) - fVar54) * fVar64;
          auVar78 = minps(auVar86,auVar91);
          auVar43 = minps(auVar43,auVar78);
          if (((uint)uVar33 & 7) == 6) {
            bVar18 = (fVar96 < *(float *)pauVar25[0xf] && *(float *)pauVar25[0xe] <= fVar96) &&
                     local_10b8._0_4_ <= auVar43._0_4_;
            bVar19 = (fVar96 < *(float *)((long)pauVar25[0xf] + 4) &&
                     *(float *)((long)pauVar25[0xe] + 4) <= fVar96) &&
                     local_10b8._4_4_ <= auVar43._4_4_;
            bVar20 = (fVar96 < *(float *)((long)pauVar25[0xf] + 8) &&
                     *(float *)((long)pauVar25[0xe] + 8) <= fVar96) &&
                     local_10b8._8_4_ <= auVar43._8_4_;
            bVar21 = (fVar96 < *(float *)((long)pauVar25[0xf] + 0xc) &&
                     *(float *)((long)pauVar25[0xe] + 0xc) <= fVar96) &&
                     local_10b8._12_4_ <= auVar43._12_4_;
          }
          else {
            bVar18 = local_10b8._0_4_ <= auVar43._0_4_;
            bVar19 = local_10b8._4_4_ <= auVar43._4_4_;
            bVar20 = local_10b8._8_4_ <= auVar43._8_4_;
            bVar21 = local_10b8._12_4_ <= auVar43._12_4_;
          }
          auVar65._0_4_ = (uint)bVar18 * -0x80000000;
          auVar65._4_4_ = (uint)bVar19 * -0x80000000;
          auVar65._8_4_ = (uint)bVar20 * -0x80000000;
          auVar65._12_4_ = (uint)bVar21 * -0x80000000;
          uVar27 = movmskps((int)context,auVar65);
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar27);
          if (uVar27 == 0) goto LAB_006856e4;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar27 != 0) {
            for (; ((byte)uVar27 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar33 = *(ulong *)((long)*pauVar25 + context * 8);
          uVar27 = (uVar27 & 0xff) - 1 & uVar27 & 0xff;
          pauVar26 = pauVar38;
          if (uVar27 != 0) {
            uVar125 = *(uint *)(local_10b8 + (long)context * 4);
            lVar35 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            uVar30 = *(ulong *)((long)*pauVar25 + lVar35 * 8);
            uVar126 = *(uint *)(local_10b8 + lVar35 * 4);
            uVar27 = uVar27 - 1 & uVar27;
            context = (RayQueryContext *)(ulong)uVar27;
            if (uVar27 == 0) {
              pauVar26 = pauVar38 + 1;
              if (uVar125 < uVar126) {
                *(ulong *)*pauVar38 = uVar30;
                *(uint *)((long)*pauVar38 + 8) = uVar126;
                pauVar38 = pauVar26;
              }
              else {
                *(ulong *)*pauVar38 = uVar33;
                *(uint *)((long)*pauVar38 + 8) = uVar125;
                uVar33 = uVar30;
                pauVar38 = pauVar26;
              }
            }
            else {
              auVar66._8_4_ = uVar125;
              auVar66._0_8_ = uVar33;
              auVar66._12_4_ = 0;
              auVar79._8_4_ = uVar126;
              auVar79._0_8_ = uVar30;
              auVar79._12_4_ = 0;
              lVar35 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar27 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              iVar24 = *(int *)(local_10b8 + lVar35 * 4);
              auVar70._8_4_ = iVar24;
              auVar70._0_8_ = *(long *)((long)*pauVar25 + lVar35 * 8);
              auVar70._12_4_ = 0;
              auVar44._8_4_ = -(uint)((int)uVar125 < (int)uVar126);
              uVar27 = uVar27 - 1 & uVar27;
              if (uVar27 == 0) {
                auVar44._4_4_ = auVar44._8_4_;
                auVar44._0_4_ = auVar44._8_4_;
                auVar44._12_4_ = auVar44._8_4_;
                auVar87._8_4_ = uVar126;
                auVar87._0_8_ = uVar30;
                auVar87._12_4_ = 0;
                auVar78 = blendvps(auVar87,auVar66,auVar44);
                auVar43 = blendvps(auVar66,auVar79,auVar44);
                auVar45._8_4_ = -(uint)(auVar78._8_4_ < iVar24);
                auVar45._4_4_ = auVar45._8_4_;
                auVar45._0_4_ = auVar45._8_4_;
                auVar45._12_4_ = auVar45._8_4_;
                auVar80._8_4_ = iVar24;
                auVar80._0_8_ = *(long *)((long)*pauVar25 + lVar35 * 8);
                auVar80._12_4_ = 0;
                auVar81 = blendvps(auVar80,auVar78,auVar45);
                auVar88 = blendvps(auVar78,auVar70,auVar45);
                auVar46._8_4_ = -(uint)(auVar43._8_4_ < auVar88._8_4_);
                auVar46._4_4_ = auVar46._8_4_;
                auVar46._0_4_ = auVar46._8_4_;
                auVar46._12_4_ = auVar46._8_4_;
                auVar78 = blendvps(auVar88,auVar43,auVar46);
                auVar43 = blendvps(auVar43,auVar88,auVar46);
                *pauVar38 = auVar43;
                pauVar38[1] = auVar78;
                uVar33 = auVar81._0_8_;
                pauVar38 = pauVar38 + 2;
                pauVar26 = pauVar38;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar47._4_4_ = auVar44._8_4_;
                auVar47._0_4_ = auVar44._8_4_;
                auVar47._8_4_ = auVar44._8_4_;
                auVar47._12_4_ = auVar44._8_4_;
                auVar88 = blendvps(auVar79,auVar66,auVar47);
                auVar43 = blendvps(auVar66,auVar79,auVar47);
                auVar92._8_4_ = *(int *)(local_10b8 + (long)context * 4);
                auVar92._0_8_ = *(long *)((long)*pauVar25 + context * 8);
                auVar92._12_4_ = 0;
                auVar48._8_4_ = -(uint)(iVar24 < *(int *)(local_10b8 + (long)context * 4));
                auVar48._4_4_ = auVar48._8_4_;
                auVar48._0_4_ = auVar48._8_4_;
                auVar48._12_4_ = auVar48._8_4_;
                auVar81 = blendvps(auVar92,auVar70,auVar48);
                auVar78 = blendvps(auVar70,auVar92,auVar48);
                auVar49._8_4_ = -(uint)(auVar43._8_4_ < auVar78._8_4_);
                auVar49._4_4_ = auVar49._8_4_;
                auVar49._0_4_ = auVar49._8_4_;
                auVar49._12_4_ = auVar49._8_4_;
                auVar93 = blendvps(auVar78,auVar43,auVar49);
                auVar43 = blendvps(auVar43,auVar78,auVar49);
                auVar50._8_4_ = -(uint)(auVar88._8_4_ < auVar81._8_4_);
                auVar50._4_4_ = auVar50._8_4_;
                auVar50._0_4_ = auVar50._8_4_;
                auVar50._12_4_ = auVar50._8_4_;
                auVar78 = blendvps(auVar81,auVar88,auVar50);
                auVar88 = blendvps(auVar88,auVar81,auVar50);
                auVar51._8_4_ = -(uint)(auVar88._8_4_ < auVar93._8_4_);
                auVar51._4_4_ = auVar51._8_4_;
                auVar51._0_4_ = auVar51._8_4_;
                auVar51._12_4_ = auVar51._8_4_;
                auVar81 = blendvps(auVar93,auVar88,auVar51);
                auVar88 = blendvps(auVar88,auVar93,auVar51);
                *pauVar38 = auVar43;
                pauVar38[1] = auVar88;
                pauVar38[2] = auVar81;
                uVar33 = auVar78._0_8_;
                pauVar38 = pauVar38 + 3;
                pauVar26 = pauVar38;
              }
            }
          }
        }
        lVar35 = (ulong)((uint)uVar33 & 0xf) - 8;
        uVar33 = uVar33 & 0xfffffffffffffff0;
        for (lVar37 = 0; lVar37 != lVar35; lVar37 = lVar37 + 1) {
          lVar34 = lVar37 * 0x140;
          fVar112 = *(float *)((long)&(This->collider).name + 4);
          pfVar5 = (float *)(uVar33 + 0x90 + lVar34);
          pfVar1 = (float *)(uVar33 + lVar34);
          fVar64 = *pfVar5 * fVar112 + *pfVar1;
          fVar67 = pfVar5[1] * fVar112 + pfVar1[1];
          fStack_1190 = pfVar5[2] * fVar112 + pfVar1[2];
          fStack_118c = pfVar5[3] * fVar112 + pfVar1[3];
          pfVar5 = (float *)(uVar33 + 0xa0 + lVar34);
          pfVar1 = (float *)(uVar33 + 0x10 + lVar34);
          fVar111 = *pfVar5 * fVar112 + *pfVar1;
          fVar114 = pfVar5[1] * fVar112 + pfVar1[1];
          fVar117 = pfVar5[2] * fVar112 + pfVar1[2];
          fVar119 = pfVar5[3] * fVar112 + pfVar1[3];
          pfVar5 = (float *)(uVar33 + 0xb0 + lVar34);
          pfVar1 = (float *)(uVar33 + 0x20 + lVar34);
          fVar68 = *pfVar5 * fVar112 + *pfVar1;
          fVar73 = pfVar5[1] * fVar112 + pfVar1[1];
          fVar74 = pfVar5[2] * fVar112 + pfVar1[2];
          fVar75 = pfVar5[3] * fVar112 + pfVar1[3];
          pfVar6 = (float *)(uVar33 + 0xc0 + lVar34);
          pfVar1 = (float *)(uVar33 + 0x30 + lVar34);
          pfVar7 = (float *)(uVar33 + 0xd0 + lVar34);
          pfVar5 = (float *)(uVar33 + 0x40 + lVar34);
          pfVar8 = (float *)(uVar33 + 0xe0 + lVar34);
          pfVar2 = (float *)(uVar33 + 0x50 + lVar34);
          pfVar9 = (float *)(uVar33 + 0xf0 + lVar34);
          pfVar3 = (float *)(uVar33 + 0x60 + lVar34);
          pfVar10 = (float *)(uVar33 + 0x100 + lVar34);
          pfVar4 = (float *)(uVar33 + 0x70 + lVar34);
          pfVar11 = (float *)(uVar33 + 0x110 + lVar34);
          pfVar12 = (float *)(uVar33 + 0x80 + lVar34);
          fVar99 = fVar64 - (*pfVar6 * fVar112 + *pfVar1);
          fVar100 = fVar67 - (pfVar6[1] * fVar112 + pfVar1[1]);
          fVar102 = fStack_1190 - (pfVar6[2] * fVar112 + pfVar1[2]);
          fVar104 = fStack_118c - (pfVar6[3] * fVar112 + pfVar1[3]);
          fVar76 = fVar111 - (*pfVar7 * fVar112 + *pfVar5);
          fVar110 = fVar114 - (pfVar7[1] * fVar112 + pfVar5[1]);
          fVar82 = fVar117 - (pfVar7[2] * fVar112 + pfVar5[2]);
          fVar83 = fVar119 - (pfVar7[3] * fVar112 + pfVar5[3]);
          fVar121 = fVar68 - (*pfVar8 * fVar112 + *pfVar2);
          fVar122 = fVar73 - (pfVar8[1] * fVar112 + pfVar2[1]);
          fVar123 = fVar74 - (pfVar8[2] * fVar112 + pfVar2[2]);
          fVar124 = fVar75 - (pfVar8[3] * fVar112 + pfVar2[3]);
          fVar57 = (*pfVar9 * fVar112 + *pfVar3) - fVar64;
          fVar116 = (pfVar9[1] * fVar112 + pfVar3[1]) - fVar67;
          fVar62 = (pfVar9[2] * fVar112 + pfVar3[2]) - fStack_1190;
          fVar63 = (pfVar9[3] * fVar112 + pfVar3[3]) - fStack_118c;
          fVar94 = (*pfVar10 * fVar112 + *pfVar4) - fVar111;
          fVar96 = (pfVar10[1] * fVar112 + pfVar4[1]) - fVar114;
          fVar97 = (pfVar10[2] * fVar112 + pfVar4[2]) - fVar117;
          fVar98 = (pfVar10[3] * fVar112 + pfVar4[3]) - fVar119;
          fVar84 = (fVar112 * *pfVar11 + *pfVar12) - fVar68;
          fVar113 = (fVar112 * pfVar11[1] + pfVar12[1]) - fVar73;
          fVar89 = (fVar112 * pfVar11[2] + pfVar12[2]) - fVar74;
          fVar90 = (fVar112 * pfVar11[3] + pfVar12[3]) - fVar75;
          fVar42 = fVar121 * fVar94 - fVar76 * fVar84;
          fVar54 = fVar122 * fVar96 - fVar110 * fVar113;
          fVar55 = fVar123 * fVar97 - fVar82 * fVar89;
          fVar56 = fVar124 * fVar98 - fVar83 * fVar90;
          fVar112 = *(float *)&This->ptr;
          fVar115 = *(float *)((long)&This->ptr + 4);
          fVar106 = *(float *)&This->leafIntersector;
          fVar109 = *(float *)&(This->collider).collide;
          fVar129 = *(float *)((long)&(This->collider).collide + 4);
          fVar69 = *(float *)&(This->collider).name;
          fVar64 = fVar64 - fVar112;
          fVar67 = fVar67 - fVar112;
          fStack_1190 = fStack_1190 - fVar112;
          fStack_118c = fStack_118c - fVar112;
          fVar111 = fVar111 - fVar115;
          fVar114 = fVar114 - fVar115;
          fVar117 = fVar117 - fVar115;
          fVar119 = fVar119 - fVar115;
          fVar134 = fVar64 * fVar129 - fVar111 * fVar109;
          fVar135 = fVar67 * fVar129 - fVar114 * fVar109;
          fVar136 = fStack_1190 * fVar129 - fVar117 * fVar109;
          fVar137 = fStack_118c * fVar129 - fVar119 * fVar109;
          local_1018._0_4_ = fVar99 * fVar84 - fVar121 * fVar57;
          local_1018._4_4_ = fVar100 * fVar113 - fVar122 * fVar116;
          local_1018._8_4_ = fVar102 * fVar89 - fVar123 * fVar62;
          local_1018._12_4_ = fVar104 * fVar90 - fVar124 * fVar63;
          fVar68 = fVar68 - fVar106;
          fVar73 = fVar73 - fVar106;
          fVar74 = fVar74 - fVar106;
          fVar75 = fVar75 - fVar106;
          local_1198 = CONCAT44(fVar67,fVar64);
          fVar130 = fVar68 * fVar109 - fVar64 * fVar69;
          fVar131 = fVar73 * fVar109 - fVar67 * fVar69;
          fVar132 = fVar74 * fVar109 - fStack_1190 * fVar69;
          fVar133 = fVar75 * fVar109 - fStack_118c * fVar69;
          local_1008[0] = fVar76 * fVar57 - fVar99 * fVar94;
          local_1008[1] = fVar110 * fVar116 - fVar100 * fVar96;
          local_1008[2] = fVar82 * fVar62 - fVar102 * fVar97;
          local_1008[3] = fVar83 * fVar63 - fVar104 * fVar98;
          fVar112 = fVar111 * fVar69 - fVar68 * fVar129;
          fVar115 = fVar114 * fVar69 - fVar73 * fVar129;
          fVar118 = fVar117 * fVar69 - fVar74 * fVar129;
          fVar120 = fVar119 * fVar69 - fVar75 * fVar129;
          fVar106 = fVar109 * fVar42 + fVar129 * local_1018._0_4_ + fVar69 * local_1008[0];
          fVar107 = fVar109 * fVar54 + fVar129 * local_1018._4_4_ + fVar69 * local_1008[1];
          fVar108 = fVar109 * fVar55 + fVar129 * local_1018._8_4_ + fVar69 * local_1008[2];
          fVar109 = fVar109 * fVar56 + fVar129 * local_1018._12_4_ + fVar69 * local_1008[3];
          uVar125 = (uint)fVar106 & 0x80000000;
          uVar126 = (uint)fVar107 & 0x80000000;
          uVar127 = (uint)fVar108 & 0x80000000;
          uVar128 = (uint)fVar109 & 0x80000000;
          local_10b8._0_4_ =
               (uint)(fVar57 * fVar112 + fVar94 * fVar130 + fVar84 * fVar134) ^ uVar125;
          local_10b8._4_4_ =
               (uint)(fVar116 * fVar115 + fVar96 * fVar131 + fVar113 * fVar135) ^ uVar126;
          fStack_10b0 = (float)((uint)(fVar62 * fVar118 + fVar97 * fVar132 + fVar89 * fVar136) ^
                               uVar127);
          fStack_10ac = (float)((uint)(fVar63 * fVar120 + fVar98 * fVar133 + fVar90 * fVar137) ^
                               uVar128);
          local_10a8 = (float)((uint)(fVar112 * fVar99 + fVar130 * fVar76 + fVar134 * fVar121) ^
                              uVar125);
          fStack_10a4 = (float)((uint)(fVar115 * fVar100 + fVar131 * fVar110 + fVar135 * fVar122) ^
                               uVar126);
          fStack_10a0 = (float)((uint)(fVar118 * fVar102 + fVar132 * fVar82 + fVar136 * fVar123) ^
                               uVar127);
          fStack_109c = (float)((uint)(fVar120 * fVar104 + fVar133 * fVar83 + fVar137 * fVar124) ^
                               uVar128);
          fVar112 = ABS(fVar106);
          fVar115 = ABS(fVar107);
          local_1088._0_8_ = CONCAT44(fVar107,fVar106) & 0x7fffffff7fffffff;
          local_1088._8_4_ = ABS(fVar108);
          local_1088._12_4_ = ABS(fVar109);
          auVar95._0_4_ =
               -(uint)((float)local_10b8._0_4_ + local_10a8 <= fVar112) &
               -(uint)((0.0 <= local_10a8 && 0.0 <= (float)local_10b8._0_4_) && fVar106 != 0.0) &
               local_ff8;
          auVar95._4_4_ =
               -(uint)((float)local_10b8._4_4_ + fStack_10a4 <= fVar115) &
               -(uint)((0.0 <= fStack_10a4 && 0.0 <= (float)local_10b8._4_4_) && fVar107 != 0.0) &
               uStack_ff4;
          auVar95._8_4_ =
               -(uint)(fStack_10b0 + fStack_10a0 <= local_1088._8_4_) &
               -(uint)((0.0 <= fStack_10a0 && 0.0 <= fStack_10b0) && fVar108 != 0.0) & uStack_ff0;
          auVar95._12_4_ =
               -(uint)(fStack_10ac + fStack_109c <= local_1088._12_4_) &
               -(uint)((0.0 <= fStack_109c && 0.0 <= fStack_10ac) && fVar109 != 0.0) & uStack_fec;
          uVar27 = movmskps((int)pauVar26,auVar95);
          pauVar26 = (undefined1 (*) [16])(ulong)uVar27;
          if (uVar27 != 0) {
            local_1098 = (float)(uVar125 ^
                                (uint)(fVar64 * fVar42 +
                                      fVar111 * local_1018._0_4_ + fVar68 * local_1008[0]));
            fStack_1094 = (float)(uVar126 ^
                                 (uint)(fVar67 * fVar54 +
                                       fVar114 * local_1018._4_4_ + fVar73 * local_1008[1]));
            fStack_1090 = (float)(uVar127 ^
                                 (uint)(fStack_1190 * fVar55 +
                                       fVar117 * local_1018._8_4_ + fVar74 * local_1008[2]));
            fStack_108c = (float)(uVar128 ^
                                 (uint)(fStack_118c * fVar56 +
                                       fVar119 * local_1018._12_4_ + fVar75 * local_1008[3]));
            fVar106 = *(float *)((long)&This->leafIntersector + 4);
            auVar14._0_8_ = (This->intersector1).intersect;
            auVar14._8_8_ = (This->intersector1).occluded;
            fVar109 = (float)auVar14._0_8_;
            uVar101 = (undefined4)((ulong)auVar14._0_8_ >> 0x20);
            uVar103 = (undefined4)auVar14._8_8_;
            uVar105 = (undefined4)((ulong)auVar14._8_8_ >> 0x20);
            auVar52._0_4_ =
                 -(uint)(local_1098 <= fVar109 * fVar112 && fVar106 * fVar112 < local_1098) &
                 auVar95._0_4_;
            auVar52._4_4_ =
                 -(uint)(fStack_1094 <= fVar109 * fVar115 && fVar106 * fVar115 < fStack_1094) &
                 auVar95._4_4_;
            auVar52._8_4_ =
                 -(uint)(fStack_1090 <= fVar109 * local_1088._8_4_ &&
                        fVar106 * local_1088._8_4_ < fStack_1090) & auVar95._8_4_;
            auVar52._12_4_ =
                 -(uint)(fStack_108c <= fVar109 * local_1088._12_4_ &&
                        fVar106 * local_1088._12_4_ < fStack_108c) & auVar95._12_4_;
            uVar27 = movmskps(uVar27,auVar52);
            pauVar26 = (undefined1 (*) [16])(ulong)uVar27;
            if (uVar27 != 0) {
              local_1068 = auVar52;
              local_1028._4_4_ = fVar54;
              local_1028._0_4_ = fVar42;
              local_1028._8_4_ = fVar55;
              local_1028._12_4_ = fVar56;
              local_1140 = *(long *)&(local_1148->super_RayK<1>).org.field_0;
              local_1188 = auVar52;
              auVar43 = rcpps(local_1028,local_1088);
              fVar69 = auVar43._0_4_;
              fVar42 = auVar43._4_4_;
              fVar54 = auVar43._8_4_;
              fVar55 = auVar43._12_4_;
              fVar69 = (1.0 - fVar112 * fVar69) * fVar69 + fVar69;
              fVar42 = (1.0 - fVar115 * fVar42) * fVar42 + fVar42;
              fVar54 = (1.0 - local_1088._8_4_ * fVar54) * fVar54 + fVar54;
              fVar55 = (1.0 - local_1088._12_4_ * fVar55) * fVar55 + fVar55;
              fVar112 = local_1098 * fVar69;
              fVar115 = fStack_1094 * fVar42;
              fVar106 = fStack_1090 * fVar54;
              fVar129 = fStack_108c * fVar55;
              local_1038[0] = fVar112;
              local_1038[1] = fVar115;
              local_1038[2] = fVar106;
              local_1038[3] = fVar129;
              local_1058[0] = (float)local_10b8._0_4_ * fVar69;
              local_1058[1] = (float)local_10b8._4_4_ * fVar42;
              local_1058[2] = fStack_10b0 * fVar54;
              local_1058[3] = fStack_10ac * fVar55;
              local_1048[0] = fVar69 * local_10a8;
              local_1048[1] = fVar42 * fStack_10a4;
              local_1048[2] = fVar54 * fStack_10a0;
              local_1048[3] = fVar55 * fStack_109c;
              auVar22._4_4_ = fVar115;
              auVar22._0_4_ = fVar112;
              auVar22._8_4_ = fVar106;
              auVar22._12_4_ = fVar129;
              auVar77 = blendvps(_DAT_01f45a30,auVar22,auVar52);
              auVar71._4_4_ = auVar77._0_4_;
              auVar71._0_4_ = auVar77._4_4_;
              auVar71._8_4_ = auVar77._12_4_;
              auVar71._12_4_ = auVar77._8_4_;
              auVar43 = minps(auVar71,auVar77);
              auVar58._0_8_ = auVar43._8_8_;
              auVar58._8_4_ = auVar43._0_4_;
              auVar58._12_4_ = auVar43._4_4_;
              auVar43 = minps(auVar58,auVar43);
              auVar59._0_8_ =
                   CONCAT44(-(uint)(auVar43._4_4_ == auVar77._4_4_) & auVar52._4_4_,
                            -(uint)(auVar43._0_4_ == auVar77._0_4_) & auVar52._0_4_);
              auVar59._8_4_ = -(uint)(auVar43._8_4_ == auVar77._8_4_) & auVar52._8_4_;
              auVar59._12_4_ = -(uint)(auVar43._12_4_ == auVar77._12_4_) & auVar52._12_4_;
              iVar24 = movmskps((int)local_1140,auVar59);
              if (iVar24 != 0) {
                auVar52._8_4_ = auVar59._8_4_;
                auVar52._0_8_ = auVar59._0_8_;
                auVar52._12_4_ = auVar59._12_4_;
              }
              uVar16 = extractps(auVar14,1);
              local_11b8 = (uint)uVar16;
              uVar28 = movmskps((int)context,auVar52);
              uVar30 = CONCAT44((int)((ulong)context >> 0x20),uVar28);
              pbVar31 = (byte *)0x0;
              if (uVar30 != 0) {
                for (; (uVar30 >> (long)pbVar31 & 1) == 0; pbVar31 = pbVar31 + 1) {
                }
              }
              local_1198 = lVar34 + uVar33;
              do {
                local_10f0 = *(uint *)(local_1198 + 0x120 + (long)pbVar31 * 4);
                pbVar17 = *(byte **)(*(long *)(local_1140 + 0x1e8) + (ulong)local_10f0 * 8);
                pauVar26 = (undefined1 (*) [16])(ulong)local_11b8;
                if ((*(uint *)(pbVar17 + 0x34) & local_11b8) == 0) {
                  *(undefined4 *)(local_1188 + (long)pbVar31 * 4) = 0;
                }
                else {
                  local_1150 = *(byte **)&(local_1148->super_RayK<1>).dir.field_0;
                  if (*(long *)(local_1150 + 0x10) == 0) {
                    local_1128 = *(uint **)((long)&(local_1148->super_RayK<1>).org.field_0 + 8);
                    if (*(long *)(pbVar17 + 0x40) == 0) {
                      fVar112 = local_1058[(long)pbVar31];
                      fVar115 = local_1048[(long)pbVar31];
                      *(float *)&(This->intersector1).intersect = local_1038[(long)pbVar31];
                      *(undefined4 *)&(This->intersector1).pointQuery =
                           *(undefined4 *)(local_1028 + (long)pbVar31 * 4);
                      *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                           *(undefined4 *)(local_1018 + (long)pbVar31 * 4);
                      *(float *)&(This->intersector1).name = local_1008[(long)pbVar31];
                      *(float *)((long)&(This->intersector1).name + 4) = fVar112;
                      *(float *)&(This->intersector4).intersect = fVar115;
                      *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                           *(undefined4 *)(local_1198 + 0x130 + (long)pbVar31 * 4);
                      *(uint *)&(This->intersector4).occluded = local_10f0;
                      context = (RayQueryContext *)(ulong)*local_1128;
                      *(uint *)((long)&(This->intersector4).occluded + 4) = *local_1128;
                      pauVar26 = (undefined1 (*) [16])(ulong)local_1128[1];
                      *(uint *)&(This->intersector4).name = local_1128[1];
                      break;
                    }
                    local_10d8 = fVar109;
                    uStack_10d4 = uVar101;
                    uStack_10d0 = uVar103;
                    uStack_10cc = uVar105;
                    local_10c8 = fVar112;
                    fStack_10c4 = fVar115;
                    fStack_10c0 = fVar106;
                    fStack_10bc = fVar129;
                    local_1170 = lVar37;
                    local_1168 = lVar35;
                    local_1160 = uVar36;
                    local_1158 = pauVar38;
                  }
                  else {
                    local_10d8 = fVar109;
                    uStack_10d4 = uVar101;
                    uStack_10d0 = uVar103;
                    uStack_10cc = uVar105;
                    local_10c8 = fVar112;
                    fStack_10c4 = fVar115;
                    fStack_10c0 = fVar106;
                    fStack_10bc = fVar129;
                    local_1170 = lVar37;
                    local_1168 = lVar35;
                    local_1160 = uVar36;
                    local_1158 = pauVar38;
                    local_1128 = *(uint **)((long)&(local_1148->super_RayK<1>).org.field_0 + 8);
                  }
                  local_1108 = *(undefined4 *)(local_1028 + (long)pbVar31 * 4);
                  local_1104 = *(undefined4 *)(local_1018 + (long)pbVar31 * 4);
                  local_1100 = local_1008[(long)pbVar31];
                  local_10fc = local_1058[(long)pbVar31];
                  local_10f8 = local_1048[(long)pbVar31];
                  local_10f4 = *(undefined4 *)(local_1198 + 0x130 + (long)pbVar31 * 4);
                  local_10ec = *local_1128;
                  local_10e8 = local_1128[1];
                  *(float *)&(This->intersector1).intersect = local_1038[(long)pbVar31];
                  local_119c = -1;
                  local_1138 = &local_119c;
                  pbVar32 = *(byte **)(pbVar17 + 0x18);
                  local_1130 = pbVar32;
                  local_1120 = This;
                  local_1118 = &local_1108;
                  local_1110 = 1;
                  local_1170 = lVar37;
                  local_1168 = lVar35;
                  local_1160 = uVar36;
                  local_1158 = pauVar38;
                  local_10d8 = fVar109;
                  uStack_10d4 = uVar101;
                  uStack_10d0 = uVar103;
                  uStack_10cc = uVar105;
                  local_10c8 = fVar112;
                  fStack_10c4 = fVar115;
                  fStack_10c0 = fVar106;
                  fStack_10bc = fVar129;
                  if (((*(code **)(pbVar17 + 0x40) == (code *)0x0) ||
                      ((**(code **)(pbVar17 + 0x40))(&local_1138), *local_1138 != 0)) &&
                     ((*(code **)(local_1150 + 0x10) == (code *)0x0 ||
                      (((pbVar32 = local_1150, (*local_1150 & 2) == 0 &&
                        (pbVar32 = pbVar17, (pbVar17[0x3e] & 0x40) == 0)) ||
                       ((**(code **)(local_1150 + 0x10))(&local_1138), *local_1138 != 0)))))) {
                    *(undefined4 *)&(local_1120->intersector1).pointQuery = *local_1118;
                    *(undefined4 *)((long)&(local_1120->intersector1).pointQuery + 4) =
                         local_1118[1];
                    *(undefined4 *)&(local_1120->intersector1).name = local_1118[2];
                    *(undefined4 *)((long)&(local_1120->intersector1).name + 4) = local_1118[3];
                    *(undefined4 *)&(local_1120->intersector4).intersect = local_1118[4];
                    *(undefined4 *)((long)&(local_1120->intersector4).intersect + 4) = local_1118[5]
                    ;
                    *(undefined4 *)&(local_1120->intersector4).occluded = local_1118[6];
                    *(undefined4 *)((long)&(local_1120->intersector4).occluded + 4) = local_1118[7];
                    pbVar32 = (byte *)(ulong)(uint)local_1118[8];
                    *(undefined4 *)&(local_1120->intersector4).name = local_1118[8];
                  }
                  else {
                    *(float *)&(This->intersector1).intersect = local_10d8;
                  }
                  *(undefined4 *)(local_1188 + (long)pbVar31 * 4) = 0;
                  auVar15._0_8_ = (This->intersector1).intersect;
                  auVar15._8_8_ = (This->intersector1).occluded;
                  fVar109 = (float)auVar15._0_8_;
                  uVar101 = (undefined4)((ulong)auVar15._0_8_ >> 0x20);
                  uVar103 = (undefined4)auVar15._8_8_;
                  uVar105 = (undefined4)((ulong)auVar15._8_8_ >> 0x20);
                  local_1188._0_4_ = -(uint)(local_10c8 <= fVar109) & local_1188._0_4_;
                  local_1188._4_4_ = -(uint)(fStack_10c4 <= fVar109) & local_1188._4_4_;
                  local_1188._8_4_ = -(uint)(fStack_10c0 <= fVar109) & local_1188._8_4_;
                  local_1188._12_4_ = -(uint)(fStack_10bc <= fVar109) & local_1188._12_4_;
                  pauVar26 = (undefined1 (*) [16])extractps(auVar15,1);
                  pbVar31 = pbVar32;
                  lVar35 = local_1168;
                  uVar36 = local_1160;
                  lVar37 = local_1170;
                  pauVar38 = local_1158;
                  fVar112 = local_10c8;
                  fVar115 = fStack_10c4;
                  fVar106 = fStack_10c0;
                  fVar129 = fStack_10bc;
                }
                uVar28 = (undefined4)((ulong)pbVar31 >> 0x20);
                iVar24 = movmskps((int)pbVar31,local_1188);
                context = (RayQueryContext *)CONCAT44(uVar28,iVar24);
                if (iVar24 == 0) break;
                auVar23._4_4_ = fVar115;
                auVar23._0_4_ = fVar112;
                auVar23._8_4_ = fVar106;
                auVar23._12_4_ = fVar129;
                auVar77 = blendvps(_DAT_01f45a30,auVar23,local_1188);
                auVar72._4_4_ = auVar77._0_4_;
                auVar72._0_4_ = auVar77._4_4_;
                auVar72._8_4_ = auVar77._12_4_;
                auVar72._12_4_ = auVar77._8_4_;
                auVar43 = minps(auVar72,auVar77);
                auVar60._0_8_ = auVar43._8_8_;
                auVar60._8_4_ = auVar43._0_4_;
                auVar60._12_4_ = auVar43._4_4_;
                auVar43 = minps(auVar60,auVar43);
                auVar61._0_8_ =
                     CONCAT44(-(uint)(auVar43._4_4_ == auVar77._4_4_) & local_1188._4_4_,
                              -(uint)(auVar43._0_4_ == auVar77._0_4_) & local_1188._0_4_);
                auVar61._8_4_ = -(uint)(auVar43._8_4_ == auVar77._8_4_) & local_1188._8_4_;
                auVar61._12_4_ = -(uint)(auVar43._12_4_ == auVar77._12_4_) & local_1188._12_4_;
                iVar24 = movmskps(iVar24,auVar61);
                auVar53 = local_1188;
                if (iVar24 != 0) {
                  auVar53._8_4_ = auVar61._8_4_;
                  auVar53._0_8_ = auVar61._0_8_;
                  auVar53._12_4_ = auVar61._12_4_;
                }
                uVar29 = movmskps(iVar24,auVar53);
                uVar30 = CONCAT44(uVar28,uVar29);
                pbVar31 = (byte *)0x0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> (long)pbVar31 & 1) == 0; pbVar31 = pbVar31 + 1) {
                  }
                }
                local_11b8 = (uint)pauVar26;
              } while( true );
            }
          }
          fVar106 = local_f88;
          fVar69 = fStack_f84;
          fVar42 = fStack_f80;
          fVar54 = fStack_f7c;
          fVar129 = local_f98;
          fVar55 = fStack_f94;
          fVar56 = fStack_f90;
          fVar57 = fStack_f8c;
          fVar116 = local_fa8;
          fVar62 = fStack_fa4;
          fVar63 = fStack_fa0;
          fVar64 = fStack_f9c;
          fVar112 = local_fb8;
          fVar67 = fStack_fb4;
          fVar68 = fStack_fb0;
          fVar73 = fStack_fac;
          fVar115 = local_fc8;
          fVar74 = fStack_fc4;
          fVar75 = fStack_fc0;
          fVar76 = fStack_fbc;
          fVar110 = local_fd8;
          fVar82 = fStack_fd4;
          fVar83 = fStack_fd0;
          fVar84 = fStack_fcc;
          fVar113 = local_fe8;
          fVar89 = fStack_fe4;
          fVar90 = fStack_fe0;
          fVar94 = fStack_fdc;
        }
        fVar109 = *(float *)&(This->intersector1).intersect;
        auVar77._4_4_ = fVar109;
        auVar77._0_4_ = fVar109;
        auVar77._8_4_ = fVar109;
        auVar77._12_4_ = fVar109;
        pauVar25 = pauVar26;
      }
      goto LAB_006856e4;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }